

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r2scan_c.hpp
# Opt level: O0

void ExchCXX::kernel_traits<ExchCXX::BuiltinR2SCAN_C>::eval_exc_vxc_unpolar_impl
               (double rho,double sigma,double lapl,double tau,double *eps,double *vrho,
               double *vsigma,double *vlapl,double *vtau)

{
  undefined8 *in_RCX;
  double *in_RDX;
  double *in_RSI;
  double *in_RDI;
  double *in_R8;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double x;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double in_XMM1_Qa;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double in_XMM3_Qa;
  double t683;
  double t682;
  double t678;
  double t673;
  double t671;
  double t669;
  double t667;
  double t665;
  double t663;
  double t662;
  double t661;
  double t656;
  double t655;
  double t653;
  double t652;
  double t648;
  double t647;
  double t646;
  double t645;
  double t641;
  double t636;
  double t634;
  double t632;
  double t630;
  double t628;
  double t626;
  double t625;
  double t624;
  double t619;
  double t618;
  double t615;
  double t614;
  double t613;
  double t610;
  double t609;
  double t605;
  double t604;
  double t600;
  double t599;
  double t598;
  double t595;
  double t591;
  double t588;
  double t587;
  double t582;
  double t581;
  double t576;
  double t575;
  double t574;
  double t570;
  double t568;
  double t567;
  double t566;
  double t562;
  double t561;
  double t560;
  double t555;
  double t553;
  double t551;
  double t549;
  double t547;
  double t545;
  double t544;
  double t543;
  double t540;
  double t539;
  double t538;
  double t535;
  double t534;
  double t531;
  double t530;
  double t529;
  double t528;
  double t526;
  double t522;
  double t520;
  double t518;
  double t515;
  double t511;
  double t510;
  double t509;
  double t508;
  double t507;
  double t506;
  double t505;
  double t502;
  double t498;
  double t496;
  double t490;
  double t488;
  double t487;
  double t486;
  double t482;
  double t478;
  double t477;
  double t476;
  double t475;
  double t474;
  double t473;
  double t470;
  double t468;
  double t461;
  double t460;
  double t459;
  double t458;
  double t454;
  double t449;
  double t444;
  double t443;
  double t442;
  double t441;
  double t440;
  double t439;
  double t436;
  double t435;
  double t432;
  double t431;
  double t430;
  double t428;
  double t427;
  double t423;
  double t422;
  double t421;
  double t417;
  double t412;
  double t406;
  double t405;
  double t403;
  double t400;
  double t399;
  double t398;
  double t396;
  double t395;
  double t394;
  double t393;
  double t392;
  double t384;
  double t383;
  double t382;
  double t381;
  double t380;
  double t379;
  double t378;
  double t377;
  double t376;
  double t375;
  double t372;
  double t370;
  double t369;
  double t368;
  double t367;
  double t366;
  double t365;
  double t364;
  double t362;
  double t360;
  double t359;
  double t357;
  double t356;
  double t355;
  double t349;
  double t344;
  double t343;
  double t342;
  double t341;
  double t338;
  double t337;
  double t336;
  double t334;
  double t333;
  double t331;
  double t330;
  double t329;
  double t326;
  double t325;
  double t324;
  double t323;
  double t322;
  double t321;
  double t320;
  double t319;
  double t318;
  double t316;
  double t315;
  double t314;
  double t313;
  double t311;
  double t310;
  double t309;
  double t308;
  double t305;
  double t304;
  double t303;
  double t302;
  double t301;
  double t300;
  double t299;
  double t298;
  double t296;
  double t295;
  double t294;
  double t293;
  double t292;
  double t290;
  double t289;
  double t287;
  double t286;
  double t285;
  double t284;
  double t283;
  double t282;
  double t280;
  double t279;
  double t277;
  double t276;
  double t272;
  double t271;
  double t269;
  double t267;
  double t266;
  double t263;
  double t262;
  double t261;
  double t260;
  double t257;
  double t255;
  double t252;
  double t251;
  double t246;
  double t244;
  double t242;
  double t240;
  double t238;
  double t236;
  double t235;
  double t234;
  double t233;
  double t230;
  double t229;
  double t228;
  double t227;
  double t226;
  double t225;
  double t224;
  double t223;
  double t220;
  double t216;
  double t213;
  double t211;
  double t209;
  double t208;
  double t206;
  double t204;
  double t203;
  double t200;
  double t198;
  double t194;
  double t192;
  double t191;
  double t190;
  double t189;
  double t184;
  double t183;
  double t174;
  double t172;
  double t166;
  double t165;
  double t160;
  double t157;
  double t156;
  double t154;
  double t150;
  double t149;
  double t148;
  double t145;
  double t144;
  double t141;
  double t137;
  double t136;
  double t135;
  double t132;
  double t130;
  double t129;
  double t128;
  double t126;
  double t125;
  double t122;
  double t118;
  double t116;
  double t115;
  double t114;
  double t113;
  double t108;
  double t107;
  double t106;
  double t104;
  double t103;
  double t102;
  double t101;
  double t100;
  double t99;
  double t95;
  double t94;
  double t93;
  double t88;
  double t84;
  double t82;
  double t81;
  double t80;
  double t79;
  double t77;
  double t75;
  double t74;
  double t72;
  double t71;
  double t69;
  double t67;
  double t66;
  double t65;
  double t64;
  double t63;
  double t60;
  double t59;
  double t58;
  double t55;
  double t54;
  double t51;
  double t50;
  double t49;
  double t48;
  double t46;
  double t44;
  double t39;
  double t37;
  double t35;
  double t34;
  double t33;
  double t31;
  double t30;
  double t27;
  double t26;
  double t25;
  double t22;
  double t18;
  double t17;
  double t16;
  double t14;
  double t13;
  double t11;
  double t10;
  double t8;
  double t594;
  double t577;
  double t416;
  double t363;
  double t288;
  double t188;
  double t187;
  double t185;
  double t181;
  double t180;
  double t179;
  double t178;
  double t177;
  double t90;
  double t43;
  double t41;
  double t21;
  double t20;
  double t19;
  double t7;
  double t5;
  double t176;
  double t175;
  double t61;
  double t40;
  double t6;
  double t4;
  double t2;
  double in_stack_fffffffffffff368;
  double in_stack_fffffffffffff370;
  double dVar101;
  
  dVar1 = safe_math::cbrt<double>(1.05459646082058e-317);
  dVar2 = 2.519842099789747 / dVar1;
  dVar3 = dVar2 * 0.9847450218426962;
  dVar4 = dVar3 * 0.053425 + 1.0;
  dVar5 = safe_math::sqrt<double>(1.05466118342018e-317);
  dVar6 = pow_3_2<double>(in_stack_fffffffffffff370);
  dVar7 = dVar1 * dVar1;
  dVar8 = (1.5393389262365056 / dVar7) * 0.123235;
  dVar9 = dVar5 * 3.79785 + dVar3 * 0.8969 + dVar6 * 0.204775 + dVar8;
  dVar10 = safe_math::log<double>(1.05481384970475e-317);
  dVar11 = dVar4 * 0.0621814 * dVar10;
  dVar12 = safe_math::cbrt<double>(1.05485485715335e-317);
  dVar13 = piecewise_functor_3<double>(false,dVar12 * 1e-15,1.0);
  dVar13 = dVar13 + dVar13 + -2.0;
  dVar14 = dVar13 * 1.9236610509315362;
  dVar15 = dVar3 * 0.0278125 + 1.0;
  dVar16 = (1.5393389262365056 / dVar7) * 0.1241775;
  dVar17 = dVar5 * 5.1785 + dVar3 * 0.905775 + dVar6 * 0.1100325 + dVar16;
  dVar18 = safe_math::log<double>(1.05504408429571e-317);
  dVar19 = dVar14 * 0.0197516734986138 * dVar15 * dVar18;
  dVar20 = safe_math::log<double>(1.05508262141609e-317);
  dVar20 = 1.0 - dVar20;
  dVar101 = 9.869604401089358;
  dVar21 = dVar20 / 9.869604401089358;
  dVar22 = piecewise_functor_3<double>(false,dVar12 * dVar12,1.0);
  dVar88 = dVar22 * dVar22;
  dVar89 = dVar88 * dVar22;
  dVar90 = 1.0 / dVar20;
  dVar23 = safe_math::exp<double>(1.05524368681663e-317);
  dVar24 = dVar23 - 1.0;
  dVar25 = dVar3 * 0.025 + 1.0;
  dVar26 = dVar3 * 0.04445 + 1.0;
  dVar27 = dVar25 * (1.0 / dVar26);
  dVar28 = in_XMM0_Qa * in_XMM0_Qa;
  dVar29 = (1.0 / dVar1) / dVar28;
  dVar30 = 1.0 / dVar88;
  dVar31 = 1.0 / dVar24;
  dVar32 = dVar90 * 1.5874010519681996 * dVar31;
  dVar33 = dVar30 * 2.080083823051904 * 1.4645918875615236 * dVar32;
  dVar34 = piecewise_functor_3<double>(false,dVar12 * dVar12 * 1e-15,1.0);
  dVar35 = dVar90 * (1.0 / dVar34);
  dVar36 = (1.0 / dVar89) * dVar31;
  dVar12 = safe_math::sqrt<double>(1.05549961282118e-317);
  dVar91 = dVar12 * dVar5;
  dVar92 = dVar91 * 0.022225 + 1.0 + dVar3 * 0.03138525;
  dVar93 = dVar13 * -0.6141934409015853 * 1.9236610509315362 + 1.0;
  dVar94 = (1.0 / (dVar92 * dVar92)) * dVar93;
  dVar95 = 1.0 / dVar5;
  dVar12 = dVar12 * dVar95;
  dVar96 = dVar12 * 0.04445 + 0.125541;
  dVar8 = dVar91 * 1.898925 + dVar3 * 0.8969 + dVar6 * 0.204775 + dVar8;
  dVar13 = 16.081979498692537 / dVar8 + 1.0;
  dVar37 = safe_math::log<double>(1.05571749577099e-317);
  dVar75 = dVar8 * dVar8;
  dVar38 = 1.0 / dVar75;
  dVar39 = safe_math::sqrt<double>(1.0557703607951e-317);
  dVar97 = dVar3 * 0.24647 + dVar39 * 1.22865 + dVar12 * 3.79785 + 3.5876;
  dVar98 = 1.0 / dVar13;
  dVar99 = dVar97 * dVar98;
  dVar16 = dVar91 * 2.58925 + dVar3 * 0.905775 + dVar6 * 0.1100325 + dVar16;
  dVar91 = 29.608749977793437 / dVar16 + 1.0;
  dVar6 = safe_math::log<double>(1.05590820511029e-317);
  dVar15 = dVar14 * dVar15;
  dVar76 = dVar16 * dVar16;
  dVar77 = 1.0 / dVar76;
  dVar78 = dVar3 * 0.248355 + dVar39 * 0.660195 + dVar12 * 5.1785 + 3.6231;
  dVar79 = 1.0 / dVar91;
  dVar80 = dVar77 * dVar78 * dVar79;
  dVar81 = dVar15 * 0.5848223622634646 * dVar80 +
           ((dVar94 * 0.0285764 * dVar96 + dVar37 * 0.01328816518) - dVar4 * dVar38 * dVar99) +
           dVar14 * -0.0021973736767207856 * dVar6;
  dVar82 = dVar5 * 0.04445 + 1.0 + dVar3 * 0.03138525;
  dVar83 = dVar2 * 4.923725109213481 * dVar81 +
           (((1.0 / dVar82) * -0.0285764 * dVar93 + dVar11) - dVar19) * -0.045;
  dVar84 = dVar35 * dVar36 * dVar83;
  dVar85 = (1.0 / dVar7) / dVar28;
  dVar37 = safe_math::exp<double>(1.05635879297929e-317);
  dVar86 = in_XMM1_Qa * dVar85 * 0.6269081516456065 * dVar37;
  dVar40 = pow_1_4<double>(dVar101);
  dVar41 = 1.0 - 1.0 / dVar40;
  dVar42 = safe_math::log<double>(1.05650306014788e-317);
  dVar42 = dVar21 * dVar89 * dVar42;
  dVar43 = (1.0 / dVar7) / in_XMM0_Qa;
  dVar44 = in_XMM3_Qa * dVar43 + in_XMM1_Qa * dVar85 * -0.125;
  dVar45 = in_XMM1_Qa * 0.001 * dVar85 * 0.125 + 2.8712340001881915;
  dVar46 = 1.0 / dVar45;
  dVar47 = dVar44 * dVar46;
  dVar6 = (double)(-(ulong)(dVar47 <= 0.0) & 0x3ff0000000000000);
  dVar12 = (double)(-(ulong)(0.0 < dVar47) & 0x3ff0000000000000);
  dVar48 = piecewise_functor_3<double>((bool)(-(dVar12 != 0.0) & 1),0.0,dVar47);
  dVar87 = 1.0 - dVar48;
  dVar49 = 1.0 / dVar87;
  x = safe_math::exp<double>(1.05675206923338e-317);
  dVar100 = (double)(-(ulong)(dVar47 <= 2.5) & 0x3ff0000000000000);
  dVar50 = (double)(-(ulong)(2.5 < dVar47) & 0x3ff0000000000000);
  dVar51 = piecewise_functor_3<double>(dVar50 != 0.0,2.5,dVar47);
  dVar52 = dVar51 * dVar51;
  dVar53 = dVar52 * dVar51;
  dVar54 = dVar52 * dVar52;
  dVar55 = dVar54 * dVar51;
  dVar56 = dVar54 * dVar52;
  dVar47 = piecewise_functor_3<double>(dVar50 != 0.0,dVar47,2.5);
  dVar57 = safe_math::exp<double>(1.05694030824445e-317);
  dVar58 = piecewise_functor_5<double>
                     (dVar6 != 0.0,x,dVar100 != 0.0,
                      -(dVar54 * 0.051848879792) * dVar53 +
                      dVar56 * 0.516884468372 +
                      dVar55 * -1.915710236206 +
                      dVar54 * 3.061560252175 +
                      dVar53 * -1.535685604549 + dVar52 * -0.4352 + dVar51 * -0.64 + 1.0,
                      dVar57 * -0.7);
  dVar59 = safe_math::exp<double>(1.05711125495791e-317);
  dVar60 = in_XMM1_Qa * 1.5874010519681996 * dVar85;
  dVar61 = pow_1_4<double>(dVar101);
  dVar62 = 1.0 - 1.0 / dVar61;
  dVar63 = safe_math::log<double>(1.05723575950066e-317);
  dVar63 = ((((1.0 / dVar82) * -0.0285764 + dVar63 * 0.0285764) * dVar93 + dVar11) - dVar19) -
           dVar42;
  dVar64 = (1.0 / dVar1) / in_XMM0_Qa;
  dVar65 = dVar64 * 2.519842099789747;
  dVar10 = dVar65 * 0.9847450218426962 * dVar10 * 0.0011073470983333333;
  dVar66 = dVar64 * 1.720508027656199;
  dVar67 = dVar95 * 1.4422495703074083 * dVar66;
  dVar68 = dVar65 * 0.9847450218426962;
  dVar69 = dVar39 * 1.4422495703074083 * dVar66;
  dVar39 = dVar69 * 0.1023875;
  dVar70 = dVar43 * 1.5393389262365056 * 0.08215666666666667;
  dVar9 = dVar4 * (1.0 / (dVar9 * dVar9)) *
          (((dVar67 * -0.632975 + -(dVar68 * 0.29896666666666666)) - dVar39) - dVar70) *
          (1.0 / (16.081979498692537 / dVar9 + 1.0)) * 1.0;
  dVar18 = dVar14 * 1.4422495703074083 * 1.720508027656199 * dVar64 * dVar18 *
           0.00018311447306006544;
  dVar69 = dVar69 * 0.05501625;
  dVar71 = dVar43 * 1.5393389262365056 * 0.082785;
  dVar17 = dVar15 * (1.0 / (dVar17 * dVar17)) *
                    (((dVar67 * -0.8630833333333333 + -(dVar68 * 0.301925)) - dVar69) - dVar71) *
                    (1.0 / (29.608749977793437 / dVar17 + 1.0)) * 0.5848223622634646;
  dVar72 = ((dVar10 + dVar9) - dVar18) - dVar17;
  dVar40 = dVar24 * ((1.0 / dVar40) /
                    (dVar84 * 0.043341108700271344 * dVar86 +
                    dVar27 * 0.027439371595564633 * in_XMM1_Qa * dVar29 * 1.2599210498948732 *
                    dVar33 + 1.0));
  dVar7 = (1.0 / dVar7) / (dVar28 * in_XMM0_Qa);
  dVar31 = dVar30 * 1.2599210498948732 * dVar90 * dVar31;
  dVar73 = in_XMM1_Qa * dVar7;
  dVar29 = dVar29 * 1.2599210498948732;
  dVar20 = 1.0 / (dVar20 * dVar20);
  dVar74 = 1.0 / (dVar24 * dVar24);
  dVar101 = safe_math::pow<double,double>(dVar101,in_stack_fffffffffffff368);
  dVar95 = dVar101 * dVar95 * dVar64 * 0.9847450218426962;
  dVar3 = (1.0 / dVar5) / dVar3;
  dVar70 = ((dVar95 * -1.26595 + -(dVar68 * 0.29896666666666666)) - dVar39) - dVar70;
  dVar5 = dVar101 * dVar3 * dVar64 * 0.9847450218426962;
  dVar39 = safe_math::sqrt<double>(1.05872882588239e-317);
  dVar66 = (1.0 / dVar39) * 1.4422495703074083 * dVar66;
  dVar71 = ((dVar95 * -1.7261666666666666 + -(dVar68 * 0.301925)) - dVar69) - dVar71;
  dVar69 = 1.0 / (dVar82 * dVar82);
  dVar39 = dVar67 * -0.007408333333333334 + -(dVar68 * 0.01046175);
  dVar67 = dVar28 * dVar28 * dVar28 * dVar28;
  dVar24 = 1.0 / (dVar24 * dVar41 + 1.0);
  dVar1 = dVar21 * dVar89 *
          (-(dVar72 * dVar90 * 9.869604401089358) * (1.0 / dVar89) * dVar23 * dVar41 +
          (dVar40 * (dVar35 * dVar36 * 0.005821825775391099 *
                     dVar83 * in_XMM1_Qa * in_XMM1_Qa * in_XMM1_Qa *
                     (1.0 / (dVar67 * in_XMM0_Qa)) * dVar37 +
                    -(dVar84 * 0.11557628986739024) * dVar73 * 0.6269081516456065 * dVar37 +
                    dVar35 * dVar36 *
                    ((((dVar69 * dVar93 * 0.0285764 * dVar39 + -dVar10) - dVar9) + dVar18 + dVar17)
                     * -0.045 +
                    dVar65 * -1.6412417030711604 * dVar81 +
                    dVar2 * 4.923725109213481 *
                    (dVar15 * 17.315859105681465 * (1.0 / (dVar76 * dVar76)) * dVar78 *
                     (1.0 / (dVar91 * dVar91)) * dVar71 +
                    dVar15 * 0.5848223622634646 *
                    dVar77 * (dVar68 * -0.082785 +
                             dVar5 * 3.4523333333333333 + -(dVar66 * 0.1100325)) * dVar79 +
                    -(dVar15 * 1.1696447245269292 * (1.0 / (dVar76 * dVar16)) * dVar78) *
                    dVar79 * dVar71 +
                    -(dVar14 * 0.9847450218426962 * 0.00542179065015087 * dVar65) * dVar80 +
                    dVar14 * 0.06506148780181044 * dVar77 * dVar71 * dVar79 +
                    -(dVar4 * (1.0 / (dVar75 * dVar75)) * 16.081979498692537 *
                     dVar97 * (1.0 / (dVar13 * dVar13))) * dVar70 +
                    -(dVar4 * dVar38 * 1.0) *
                    (dVar68 * -0.08215666666666667 + dVar5 * 2.5319 + -(dVar66 * 0.204775)) * dVar98
                    + dVar4 * (1.0 / (dVar75 * dVar8)) * 2.0 * dVar99 * dVar70 +
                      dVar64 * dVar38 * 0.044189633301733915 * dVar99 +
                      -(dVar38 * 0.2137 * dVar70) * dVar98 +
                      ((1.0 / (dVar92 * dVar92)) / dVar92) * dVar93 * -0.0571528 *
                      dVar96 * (dVar95 * -0.014816666666666667 + -(dVar68 * 0.01046175)) +
                      dVar94 * dVar101 * 0.0008468139866666666 * dVar3 * 1.4422495703074083 *
                      0.6827840632552955 * dVar64)) * 0.043341108700271344 * dVar86 +
                    dVar20 * (1.0 / dVar34) * (1.0 / (dVar88 * dVar88 * dVar88)) *
                    dVar74 * dVar83 * 0.3949273883044934 * 0.043341108700271344 *
                    dVar60 * dVar37 * dVar72 * dVar23 * 9.869604401089358 +
                    dVar27 * in_XMM1_Qa * dVar29 *
                    ((1.0 / (dVar88 * dVar88)) / dVar22) * 2.080083823051904 * 0.027439371595564633
                    * dVar20 * 2.3248947030192535 * dVar74 * dVar72 * dVar23 * 9.869604401089358 +
                    -(dVar27 * 0.0640252003896508 * in_XMM1_Qa *
                      ((1.0 / dVar1) / (dVar28 * in_XMM0_Qa)) * 1.2599210498948732) * dVar33 +
                    dVar7 * (1.0 / dVar26) * -0.002743937159556463 * in_XMM1_Qa * dVar31 +
                    dVar25 * (1.0 / (dVar26 * dVar26)) * 0.004878720269691391 * dVar73 * dVar31)) /
          4.0) * dVar24;
  dVar44 = dVar44 * (1.0 / (dVar45 * dVar45));
  dVar2 = (in_XMM3_Qa * -1.6666666666666667 * dVar85 + dVar73 / 3.0) * dVar46 +
          (dVar44 * in_XMM1_Qa * 0.001 * dVar7) / 3.0;
  dVar4 = piecewise_functor_3<double>(dVar12 != 0.0,0.0,dVar2);
  dVar48 = dVar48 * (1.0 / (dVar87 * dVar87));
  dVar5 = piecewise_functor_3<double>(dVar50 != 0.0,0.0,dVar2);
  dVar7 = 1.0 / ((1.0 - dVar47) * (1.0 - dVar47));
  dVar2 = piecewise_functor_3<double>(dVar50 != 0.0,dVar2,0.0);
  dVar2 = piecewise_functor_5<double>
                    (dVar6 != 0.0,(dVar4 * -0.64 * dVar49 + -(dVar48 * 0.64 * dVar4)) * x,
                     dVar100 != 0.0,
                     -(dVar56 * 0.362942158544) * dVar5 +
                     dVar55 * dVar5 * 3.101306810232 +
                     dVar54 * dVar5 * -9.57855118103 +
                     dVar53 * dVar5 * 12.2462410087 +
                     dVar52 * dVar5 * -4.607056813647 + dVar5 * -0.64 + -(dVar51 * dVar5 * 0.8704),
                     dVar7 * -1.05 * dVar2 * dVar57);
  dVar69 = dVar69 * dVar39;
  dVar4 = (dVar59 - 1.0) * ((1.0 / dVar61) / (dVar60 * 0.00842681926885735 + 1.0));
  dVar5 = 1.0 / ((dVar59 - 1.0) * dVar62 + 1.0);
  dVar8 = (dVar21 * dVar89 * dVar40 *
          (-(dVar35 * dVar36 * 0.002183184665771662 * dVar83 * in_XMM1_Qa * in_XMM1_Qa) *
           (1.0 / dVar67) * dVar37 +
          dVar27 * 0.027439371595564633 * dVar29 * dVar30 * dVar32 * 3.0464738926897783 +
          dVar84 * 0.043341108700271344 * dVar85 * 1.5874010519681996 * dVar37 * 0.3949273883044934)
          * dVar24) / 4.0;
  dVar13 = (-dVar44 * dVar85 * 0.001) / 8.0 - (dVar85 * dVar46) / 8.0;
  dVar14 = piecewise_functor_3<double>(dVar12 != 0.0,0.0,dVar13);
  dVar15 = piecewise_functor_3<double>(dVar50 != 0.0,0.0,dVar13);
  dVar13 = piecewise_functor_3<double>(dVar50 != 0.0,dVar13,0.0);
  dVar13 = piecewise_functor_5<double>
                     (dVar6 != 0.0,(dVar14 * -0.64 * dVar49 + -(dVar48 * 0.64 * dVar14)) * x,
                      dVar100 != 0.0,
                      -(dVar56 * 0.362942158544) * dVar15 +
                      dVar55 * dVar15 * 3.101306810232 +
                      dVar54 * dVar15 * -9.57855118103 +
                      dVar53 * dVar15 * 12.2462410087 +
                      dVar52 * dVar15 * -4.607056813647 +
                      dVar15 * -0.64 + -(dVar51 * dVar15 * 0.8704),dVar7 * -1.05 * dVar13 * dVar57);
  dVar43 = dVar43 * dVar46;
  dVar12 = piecewise_functor_3<double>(dVar12 != 0.0,0.0,dVar43);
  dVar14 = piecewise_functor_3<double>(dVar50 != 0.0,0.0,dVar43);
  dVar15 = piecewise_functor_3<double>(dVar50 != 0.0,dVar43,0.0);
  dVar6 = piecewise_functor_5<double>
                    (dVar6 != 0.0,(dVar12 * -0.64 * dVar49 + -(dVar48 * 0.64 * dVar12)) * x,
                     dVar100 != 0.0,
                     -(dVar56 * 0.362942158544) * dVar14 +
                     dVar55 * dVar14 * 3.101306810232 +
                     dVar54 * dVar14 * -9.57855118103 +
                     dVar53 * dVar14 * 12.2462410087 +
                     dVar52 * dVar14 * -4.607056813647 +
                     dVar14 * -0.64 + -(dVar51 * dVar14 * 0.8704),dVar7 * -1.05 * dVar15 * dVar57);
  *in_RDI = -dVar11 + dVar19 + dVar42 + dVar58 * dVar63;
  *in_RSI = in_XMM0_Qa *
            ((((dVar10 + dVar9) - dVar18) - dVar17) + dVar1 + dVar2 * dVar63 +
            dVar58 * (((((dVar69 * 0.0285764 +
                         (dVar69 * -1.0 * dVar59 * dVar62 +
                         -(dVar4 * 1.8171205928321397 * 0.014225094736250906 * 0.34500085141213216 *
                          dVar73)) * 0.0285764 * dVar5) * dVar93 + -dVar10) - dVar9) + dVar18 +
                      dVar17) - dVar1)) + -dVar11 + dVar19 + dVar42 + dVar58 * dVar63;
  *in_RDX = in_XMM0_Qa *
            (dVar8 + dVar13 * dVar63 +
            dVar58 * (dVar4 * 0.3949273883044934 * 0.00015243824895787514 *
                      dVar85 * 1.5874010519681996 * dVar5 * dVar93 + -dVar8));
  *in_RCX = 0;
  *in_R8 = in_XMM0_Qa * dVar6 * dVar63;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_vxc_unpolar_impl( double rho, double sigma, double lapl, double tau, double& eps, double& vrho, double& vsigma, double& vlapl, double& vtau ) {

    (void)(lapl);
    (void)(eps);
    constexpr double t2 = constants::m_cbrt_3;
    constexpr double t4 = constants::m_cbrt_one_ov_pi;
    constexpr double t6 = constants::m_cbrt_4;
    constexpr double t40 = constants::m_cbrt_2;
    constexpr double t61 = constants::m_pi_sq;
    constexpr double t175 = constants::m_cbrt_6;
    constexpr double t176 = constants::m_cbrt_pi_sq;
    constexpr double t5 = t2 * t4;
    constexpr double t7 = t6 * t6;
    constexpr double t19 = t2 * t2;
    constexpr double t20 = t4 * t4;
    constexpr double t21 = t19 * t20;
    constexpr double t41 = t40 - 0.1e1;
    constexpr double t43 = 0.1e1 / t41 / 0.2e1;
    constexpr double t90 = 0.1e1 / t4;
    constexpr double t177 = t176 * t176;
    constexpr double t178 = 0.1e1 / t177;
    constexpr double t179 = t175 * t178;
    constexpr double t180 = t40 * t40;
    constexpr double t181 = t179 * t180;
    constexpr double t185 = t175 * t175;
    constexpr double t187 = 0.1e1 / t176 / t61;
    constexpr double t188 = t185 * t187;
    constexpr double t288 = t4 * t7;
    constexpr double t363 = t90 * t6;
    constexpr double t416 = t5 * t7;
    constexpr double t577 = t178 * t180;
    constexpr double t594 = t19 * t90;


    const double t8 = safe_math::cbrt( rho );
    const double t10 = t7 / t8;
    const double t11 = t5 * t10;
    const double t13 = 0.1e1 + 0.53425e-1 * t11;
    const double t14 = safe_math::sqrt( t11 );
    const double t16 = 0.8969e0 * t11;
    const double t17 = pow_3_2( t11 );
    const double t18 = 0.204775e0 * t17;
    const double t22 = t8 * t8;
    const double t25 = t21 * t6 / t22;
    const double t26 = 0.123235e0 * t25;
    const double t27 = 0.379785e1 * t14 + t16 + t18 + t26;
    const double t30 = 0.1e1 + 0.16081979498692535067e2 / t27;
    const double t31 = safe_math::log( t30 );
    const double t33 = 0.621814e-1 * t13 * t31;
    const double t34 = 0.1e1 <= zeta_tol;
    const double t35 = safe_math::cbrt( zeta_tol );
    const double t37 = piecewise_functor_3( t34, t35 * zeta_tol, 1.0 );
    const double t39 = 0.2e1 * t37 - 0.2e1;
    const double t44 = t39 * t43;
    const double t46 = 0.1e1 + 0.278125e-1 * t11;
    const double t48 = 0.905775e0 * t11;
    const double t49 = 0.1100325e0 * t17;
    const double t50 = 0.1241775e0 * t25;
    const double t51 = 0.51785e1 * t14 + t48 + t49 + t50;
    const double t54 = 0.1e1 + 0.29608749977793437516e2 / t51;
    const double t55 = safe_math::log( t54 );
    const double t58 = 0.19751673498613801407e-1 * t44 * t46 * t55;
    const double t59 = safe_math::log( 0.2e1 );
    const double t60 = 0.1e1 - t59;
    const double t63 = t60 / t61;
    const double t64 = t35 * t35;
    const double t65 = piecewise_functor_3( t34, t64, 1.0 );
    const double t66 = t65 * t65;
    const double t67 = t66 * t65;
    const double t69 = 0.1e1 / t60;
    const double t71 = 0.1e1 / t67;
    const double t72 = t61 * t71;
    const double t74 = safe_math::exp( -( -t33 + t58 ) * t69 * t72 );
    const double t75 = t74 - 0.1e1;
    const double t77 = 0.1e1 + 0.25e-1 * t11;
    const double t79 = 0.1e1 + 0.4445e-1 * t11;
    const double t80 = 0.1e1 / t79;
    const double t81 = t77 * t80;
    const double t82 = rho * rho;
    const double t84 = 0.1e1 / t8 / t82;
    const double t88 = 0.1e1 / t66;
    const double t93 = 0.1e1 / t75;
    const double t94 = t6 * t69 * t93;
    const double t95 = t88 * t19 * t90 * t94;
    const double t99 = piecewise_functor_3( t34, t64 * zeta_tol, 1.0 );
    const double t100 = 0.1e1 / t99;
    const double t101 = t69 * t100;
    const double t102 = t71 * t93;
    const double t103 = safe_math::sqrt( 0.4e1 );
    const double t104 = t103 * t14;
    const double t106 = 0.3138525e-1 * t11;
    const double t107 = 0.1e1 + 0.22225e-1 * t104 + t106;
    const double t108 = t107 * t107;
    const double t113 = 0.1e1 - 0.2363e1 * t41 * t39 * t43;
    const double t114 = 0.1e1 / t108 * t113;
    const double t115 = 0.1e1 / t14;
    const double t116 = t103 * t115;
    const double t118 = 0.4445e-1 * t116 + 0.125541e0;
    const double t122 = 0.1898925e1 * t104 + t16 + t18 + t26;
    const double t125 = 0.1e1 + 0.16081979498692535067e2 / t122;
    const double t126 = safe_math::log( t125 );
    const double t128 = t122 * t122;
    const double t129 = 0.1e1 / t128;
    const double t130 = t13 * t129;
    const double t132 = safe_math::sqrt( t11 );
    const double t135 = 0.379785e1 * t116 + 0.35876e1 + 0.122865e1 * t132 + 0.24647e0 * t11;
    const double t136 = 0.1e1 / t125;
    const double t137 = t135 * t136;
    const double t141 = 0.258925e1 * t104 + t48 + t49 + t50;
    const double t144 = 0.1e1 + 0.29608749977793437516e2 / t141;
    const double t145 = safe_math::log( t144 );
    const double t148 = t44 * t46;
    const double t149 = t141 * t141;
    const double t150 = 0.1e1 / t149;
    const double t154 = 0.51785e1 * t116 + 0.36231e1 + 0.660195e0 * t132 + 0.248355e0 * t11;
    const double t156 = 0.1e1 / t144;
    const double t157 = t150 * t154 * t156;
    const double t160 = 0.285764e-1 * t114 * t118 + 0.1328816518e-1 * t126 - 0.1e1 * t130 * t137 - 0.21973736767207854065e-2 * t44 * t145 + 0.5848223622634646207e0 * t148 * t157;
    const double t165 = 0.1e1 + 0.4445e-1 * t14 + t106;
    const double t166 = 0.1e1 / t165;
    const double t172 = 0.5e1 * t5 * t10 * t160 - 0.45e2 * eta * ( -0.285764e-1 * t166 * t113 + t33 - t58 );
    const double t174 = t101 * t102 * t172;
    const double t183 = 0.1e1 / t22 / t82;
    const double t184 = sigma * t183;
    const double t189 = sigma * sigma;
    const double t190 = t40 * t189;
    const double t191 = t82 * t82;
    const double t192 = t191 * rho;
    const double t194 = 0.1e1 / t8 / t192;
    const double t198 = safe_math::exp( -0.20444604078896369094e0 * t188 * t190 * t194 );
    const double t200 = t181 * t184 * t198;
    const double t203 = 0.1e1 + 0.27439371595564631661e-1 * t81 * sigma * t84 * t40 * t95 + 0.43341108700271342816e-1 * t174 * t200;
    const double t204 = pow_1_4( t203 );
    const double t206 = 0.1e1 - 0.1e1 / t204;
    const double t208 = t75 * t206 + 0.1e1;
    const double t209 = safe_math::log( t208 );
    const double t211 = t63 * t67 * t209;
    const double t213 = 0.1e1 / t22 / rho;
    const double t216 = tau * t213 - t184 / 0.8e1;
    const double t220 = eta * sigma;
    const double t223 = 0.3e1 / 0.2e2 * t185 * t177 * t40 + t220 * t183 / 0.8e1;
    const double t224 = 0.1e1 / t223;
    const double t225 = t216 * t224;
    const double t226 = t225 <= 0.e0;
    const double t227 = 0.e0 < t225;
    const double t228 = piecewise_functor_3( t227, 0.0, t225 );
    const double t229 = 0.1e1 - t228;
    const double t230 = 0.1e1 / t229;
    const double t233 = safe_math::exp( -0.64e0 * t228 * t230 );
    const double t234 = t225 <= 0.25e1;
    const double t235 = 0.25e1 < t225;
    const double t236 = piecewise_functor_3( t235, 0.25e1, t225 );
    const double t238 = t236 * t236;
    const double t240 = t238 * t236;
    const double t242 = t238 * t238;
    const double t244 = t242 * t236;
    const double t246 = t242 * t238;
    const double t251 = piecewise_functor_3( t235, t225, 0.25e1 );
    const double t252 = 0.1e1 - t251;
    const double t255 = safe_math::exp( 0.15e1 / t252 );
    const double t257 = piecewise_functor_5( t226, t233, t234, 0.1e1 - 0.64e0 * t236 - 0.4352e0 * t238 - 0.1535685604549e1 * t240 + 0.3061560252175e1 * t242 - 0.1915710236206e1 * t244 + 0.516884468372e0 * t246 - 0.51848879792e-1 * t242 * t240, -0.7e0 * t255 );
    const double t260 = safe_math::exp( 0.1e1 * t166 );
    const double t261 = t260 - 0.1e1;
    const double t262 = t180 * sigma;
    const double t263 = t262 * t183;
    const double t266 = 0.1e1 + 0.21337642104376358333e-1 * t179 * t263;
    const double t267 = pow_1_4( t266 );
    const double t269 = 0.1e1 - 0.1e1 / t267;
    const double t271 = t261 * t269 + 0.1e1;
    const double t272 = safe_math::log( t271 );
    const double t276 = ( -0.285764e-1 * t166 + 0.285764e-1 * t272 ) * t113 + t33 - t58 - t211;
    const double t277 = t257 * t276;
    const double t279 = 0.1e1 / t8 / rho;
    const double t280 = t7 * t279;
    const double t282 = t5 * t280 * t31;
    const double t283 = 0.11073470983333333333e-2 * t282;
    const double t284 = t27 * t27;
    const double t285 = 0.1e1 / t284;
    const double t286 = t13 * t285;
    const double t287 = t115 * t2;
    const double t289 = t288 * t279;
    const double t290 = t287 * t289;
    const double t292 = t5 * t280;
    const double t293 = 0.29896666666666666667e0 * t292;
    const double t294 = t132 * t2;
    const double t295 = t294 * t289;
    const double t296 = 0.1023875e0 * t295;
    const double t298 = t21 * t6 * t213;
    const double t299 = 0.82156666666666666667e-1 * t298;
    const double t300 = -0.632975e0 * t290 - t293 - t296 - t299;
    const double t301 = 0.1e1 / t30;
    const double t302 = t300 * t301;
    const double t303 = t286 * t302;
    const double t304 = 0.1e1 * t303;
    const double t305 = t44 * t2;
    const double t308 = t305 * t288 * t279 * t55;
    const double t309 = 0.18311447306006545054e-3 * t308;
    const double t310 = t51 * t51;
    const double t311 = 0.1e1 / t310;
    const double t313 = 0.301925e0 * t292;
    const double t314 = 0.5501625e-1 * t295;
    const double t315 = 0.82785e-1 * t298;
    const double t316 = -0.86308333333333333334e0 * t290 - t313 - t314 - t315;
    const double t318 = 0.1e1 / t54;
    const double t319 = t311 * t316 * t318;
    const double t320 = t148 * t319;
    const double t321 = 0.5848223622634646207e0 * t320;
    const double t322 = t283 + t304 - t309 - t321;
    const double t323 = t322 * t69;
    const double t324 = t323 * t61;
    const double t325 = t71 * t74;
    const double t326 = t325 * t206;
    const double t329 = 0.1e1 / t204 / t203;
    const double t330 = t75 * t329;
    const double t331 = t82 * rho;
    const double t333 = 0.1e1 / t22 / t331;
    const double t334 = t333 * t80;
    const double t336 = t40 * t88;
    const double t337 = t69 * t93;
    const double t338 = t336 * t337;
    const double t341 = t79 * t79;
    const double t342 = 0.1e1 / t341;
    const double t343 = t77 * t342;
    const double t344 = sigma * t333;
    const double t349 = 0.1e1 / t8 / t331;
    const double t355 = t81 * sigma;
    const double t356 = t84 * t40;
    const double t357 = t66 * t66;
    const double t359 = 0.1e1 / t357 / t65;
    const double t360 = t359 * t19;
    const double t362 = t355 * t356 * t360;
    const double t364 = t60 * t60;
    const double t365 = 0.1e1 / t364;
    const double t366 = t363 * t365;
    const double t367 = t75 * t75;
    const double t368 = 0.1e1 / t367;
    const double t369 = t368 * t322;
    const double t370 = t61 * t74;
    const double t372 = t366 * t369 * t370;
    const double t375 = t365 * t100;
    const double t376 = t357 * t66;
    const double t377 = 0.1e1 / t376;
    const double t378 = t375 * t377;
    const double t379 = t368 * t172;
    const double t380 = t379 * t179;
    const double t381 = t378 * t380;
    const double t382 = t198 * t322;
    const double t383 = t382 * t370;
    const double t384 = t263 * t383;
    const double t392 = 0.1e1 / t108 / t107 * t113;
    const double t393 = safe_math::pow( 0.4e1, 0.1e1 / 0.6e1 );
    const double t394 = t393 * t115;
    const double t395 = t5 * t279;
    const double t396 = t394 * t395;
    const double t398 = 0.1046175e-1 * t292;
    const double t399 = -0.14816666666666666667e-1 * t396 - t398;
    const double t400 = t118 * t399;
    const double t403 = t114 * t393;
    const double t405 = 0.1e1 / t14 / t11;
    const double t406 = t405 * t2;
    const double t412 = -0.126595e1 * t396 - t293 - t296 - t299;
    const double t417 = t279 * t129;
    const double t421 = t128 * t122;
    const double t422 = 0.1e1 / t421;
    const double t423 = t13 * t422;
    const double t427 = t393 * t405;
    const double t428 = t427 * t395;
    const double t430 = 0.1e1/safe_math::sqrt( t11 );
    const double t431 = t430 * t2;
    const double t432 = t431 * t289;
    const double t435 = 0.25319e1 * t428 - 0.204775e0 * t432 - 0.82156666666666666667e-1 * t292;
    const double t436 = t435 * t136;
    const double t439 = t128 * t128;
    const double t440 = 0.1e1 / t439;
    const double t441 = t13 * t440;
    const double t442 = t125 * t125;
    const double t443 = 0.1e1 / t442;
    const double t444 = t135 * t443;
    const double t449 = -0.17261666666666666667e1 * t396 - t313 - t314 - t315;
    const double t454 = t44 * t5;
    const double t458 = t149 * t141;
    const double t459 = 0.1e1 / t458;
    const double t460 = t459 * t154;
    const double t461 = t156 * t449;
    const double t468 = 0.34523333333333333333e1 * t428 - 0.1100325e0 * t432 - 0.82785e-1 * t292;
    const double t470 = t150 * t468 * t156;
    const double t473 = t149 * t149;
    const double t474 = 0.1e1 / t473;
    const double t475 = t474 * t154;
    const double t476 = t144 * t144;
    const double t477 = 0.1e1 / t476;
    const double t478 = t477 * t449;
    const double t482 = -0.571528e-1 * t392 * t400 + 0.84681398666666666666e-3 * t403 * t406 * t4 * t279 - 0.2137e0 * t129 * t412 * t136 + 0.17808333333333333333e-1 * t416 * t417 * t137 + 0.2e1 * t423 * t137 * t412 - 0.1e1 * t130 * t436 - 0.16081979498692535067e2 * t441 * t444 * t412 + 0.65061487801810439052e-1 * t44 * t150 * t449 * t156 - 0.54217906501508699211e-2 * t454 * t280 * t157 - 0.11696447245269292414e1 * t148 * t460 * t461 + 0.5848223622634646207e0 * t148 * t470 + 0.17315859105681463759e2 * t148 * t475 * t478;
    const double t486 = t165 * t165;
    const double t487 = 0.1e1 / t486;
    const double t488 = t487 * t113;
    const double t490 = -0.74083333333333333333e-2 * t290 - t398;
    const double t496 = -0.5e1 / 0.3e1 * t5 * t280 * t160 + 0.5e1 * t5 * t10 * t482 - 0.45e2 * eta * ( 0.285764e-1 * t488 * t490 - t283 - t304 + t309 + t321 );
    const double t498 = t101 * t102 * t496;
    const double t502 = t181 * t344 * t198;
    const double t505 = t101 * t102;
    const double t506 = t189 * sigma;
    const double t507 = t172 * t506;
    const double t508 = t191 * t191;
    const double t509 = t508 * rho;
    const double t510 = 0.1e1 / t509;
    const double t511 = t510 * t198;
    const double t515 = -0.27439371595564631661e-2 * t334 * sigma * t338 + 0.48787202696913915093e-2 * t343 * t344 * t338 - 0.64025200389650807209e-1 * t81 * sigma * t349 * t40 * t95 + 0.27439371595564631661e-1 * t362 * t372 + 0.43341108700271342816e-1 * t381 * t384 + 0.43341108700271342816e-1 * t498 * t200 - 0.11557628986739024751e0 * t174 * t502 + 0.58218257753910989057e-2 * t505 * t507 * t511;
    const double t518 = -t324 * t326 + t330 * t515 / 0.4e1;
    const double t520 = 0.1e1 / t208;
    const double t522 = t63 * t67 * t518 * t520;
    const double t526 = -0.5e1 / 0.3e1 * tau * t183 + t344 / 0.3e1;
    const double t528 = t223 * t223;
    const double t529 = 0.1e1 / t528;
    const double t530 = t216 * t529;
    const double t531 = t220 * t333;
    const double t534 = t526 * t224 + t530 * t531 / 0.3e1;
    const double t535 = piecewise_functor_3( t227, 0.0, t534 );
    const double t538 = t229 * t229;
    const double t539 = 0.1e1 / t538;
    const double t540 = t228 * t539;
    const double t543 = -0.64e0 * t535 * t230 - 0.64e0 * t540 * t535;
    const double t544 = t543 * t233;
    const double t545 = piecewise_functor_3( t235, 0.0, t534 );
    const double t547 = t236 * t545;
    const double t549 = t238 * t545;
    const double t551 = t240 * t545;
    const double t553 = t242 * t545;
    const double t555 = t244 * t545;
    const double t560 = t252 * t252;
    const double t561 = 0.1e1 / t560;
    const double t562 = piecewise_functor_3( t235, t534, 0.0 );
    const double t566 = piecewise_functor_5( t226, t544, t234, -0.64e0 * t545 - 0.8704e0 * t547 - 0.4607056813647e1 * t549 + 0.122462410087e2 * t551 - 0.957855118103e1 * t553 + 0.3101306810232e1 * t555 - 0.362942158544e0 * t246 * t545, -0.105e1 * t561 * t562 * t255 );
    const double t567 = t566 * t276;
    const double t568 = t487 * t490;
    const double t570 = t260 * t269;
    const double t574 = 0.1e1 / t267 / t266;
    const double t575 = t261 * t574;
    const double t576 = t575 * t175;
    const double t581 = -0.1e1 * t568 * t570 - 0.14225094736250905555e-1 * t576 * t577 * t344;
    const double t582 = 0.1e1 / t271;
    const double t587 = ( 0.285764e-1 * t568 + 0.285764e-1 * t581 * t582 ) * t113 - t283 - t304 + t309 + t321 - t522;
    const double t588 = t257 * t587;
    const double t591 = t63 * t67;
    const double t595 = t594 * t94;
    const double t598 = t180 * t183;
    const double t599 = t598 * t198;
    const double t600 = t179 * t599;
    const double t604 = 0.1e1 / t508;
    const double t605 = t604 * t198;
    const double t609 = 0.27439371595564631661e-1 * t81 * t356 * t88 * t595 + 0.43341108700271342816e-1 * t174 * t600 - 0.21831846657716620896e-2 * t505 * t172 * t189 * t605;
    const double t610 = t609 * t520;
    const double t613 = t591 * t330 * t610 / 0.4e1;
    const double t614 = t183 * t224;
    const double t615 = eta * t183;
    const double t618 = -t530 * t615 / 0.8e1 - t614 / 0.8e1;
    const double t619 = piecewise_functor_3( t227, 0.0, t618 );
    const double t624 = -0.64e0 * t619 * t230 - 0.64e0 * t540 * t619;
    const double t625 = t624 * t233;
    const double t626 = piecewise_functor_3( t235, 0.0, t618 );
    const double t628 = t236 * t626;
    const double t630 = t238 * t626;
    const double t632 = t240 * t626;
    const double t634 = t242 * t626;
    const double t636 = t244 * t626;
    const double t641 = piecewise_functor_3( t235, t618, 0.0 );
    const double t645 = piecewise_functor_5( t226, t625, t234, -0.64e0 * t626 - 0.8704e0 * t628 - 0.4607056813647e1 * t630 + 0.122462410087e2 * t632 - 0.957855118103e1 * t634 + 0.3101306810232e1 * t636 - 0.362942158544e0 * t246 * t626, -0.105e1 * t561 * t641 * t255 );
    const double t646 = t645 * t276;
    const double t647 = t575 * t179;
    const double t648 = t582 * t113;
    const double t652 = 0.15243824895787514157e-3 * t647 * t598 * t648 - t613;
    const double t653 = t257 * t652;
    const double t655 = t213 * t224;
    const double t656 = piecewise_functor_3( t227, 0.0, t655 );
    const double t661 = -0.64e0 * t656 * t230 - 0.64e0 * t540 * t656;
    const double t662 = t661 * t233;
    const double t663 = piecewise_functor_3( t235, 0.0, t655 );
    const double t665 = t236 * t663;
    const double t667 = t238 * t663;
    const double t669 = t240 * t663;
    const double t671 = t242 * t663;
    const double t673 = t244 * t663;
    const double t678 = piecewise_functor_3( t235, t655, 0.0 );
    const double t682 = piecewise_functor_5( t226, t662, t234, -0.64e0 * t663 - 0.8704e0 * t665 - 0.4607056813647e1 * t667 + 0.122462410087e2 * t669 - 0.957855118103e1 * t671 + 0.3101306810232e1 * t673 - 0.362942158544e0 * t246 * t663, -0.105e1 * t561 * t678 * t255 );
    const double t683 = rho * t682;


    eps = -t33 + t58 + t211 + t277;
    vrho = -t33 + t58 + t211 + t277 + rho * ( t283 + t304 - t309 - t321 + t522 + t567 + t588 );
    vsigma = rho * ( t613 + t646 + t653 );
    vlapl = 0.e0;
    vtau = t683 * t276;

  }